

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

string * __thiscall
do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator()(string *__return_storage_ptr__,
          do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  void *local_30;
  vector<char,_std::allocator<char>_> vec;
  
  ::wasm::read_stdin();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)__return_storage_ptr__,local_30,
             vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start);
  if (local_30 != (void *)0x0) {
    operator_delete(local_30,(long)vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string do_read_stdin<std::string>::operator()() {
  auto vec = wasm::read_stdin();
  return std::string(vec.begin(), vec.end());
}